

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O2

void __thiscall
fizplex::SimplexTest_RangeRowBoundedVarOptimalSolution_Test::
~SimplexTest_RangeRowBoundedVarOptimalSolution_Test
          (SimplexTest_RangeRowBoundedVarOptimalSolution_Test *this)

{
  SimplexTest::~SimplexTest(&this->super_SimplexTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST_F(SimplexTest, RangeRowBoundedVarOptimalSolution) {
  lp.add_column(ColType::Bounded, -4, 6, -5);
  lp.add_row(RowType::Range, -5, 5, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-25.0, z);
  EXPECT_EQ(DVector({5.0, 0.0}), x);
}